

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

ON_ClassArray<ON_SubDEdgePtr> * __thiscall
ON_ClassArray<ON_SubDEdgePtr>::operator=
          (ON_ClassArray<ON_SubDEdgePtr> *this,ON_ClassArray<ON_SubDEdgePtr> *src)

{
  int iVar1;
  uint uVar2;
  ON_SubDEdgePtr *pOVar3;
  ON_SubDEdgePtr *pOVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (this != src) {
    iVar1 = src->m_count;
    if ((long)iVar1 < 1) {
      this->m_count = 0;
    }
    else {
      if (this->m_capacity < iVar1) {
        SetCapacity(this,(long)iVar1);
      }
      pOVar3 = this->m_a;
      if (pOVar3 != (ON_SubDEdgePtr *)0x0) {
        uVar2 = src->m_count;
        this->m_count = uVar2;
        pOVar4 = src->m_a;
        uVar6 = 0;
        uVar5 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar5 = uVar6;
        }
        for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          pOVar3[uVar6].m_ptr = pOVar4[uVar6].m_ptr;
        }
      }
    }
  }
  return this;
}

Assistant:

ON_ClassArray<T>& ON_ClassArray<T>::operator=( const ON_ClassArray<T>& src )
{
  int i;
  if( this != &src ) {
    if ( src.m_count <= 0 ) {
      m_count = 0;
    }
    else {
      if ( m_capacity < src.m_count ) {
        SetCapacity( src.m_count );
      }
      if ( m_a ) {
        m_count = src.m_count;
        for ( i = 0; i < m_count; i++ ) {
          m_a[i] = src.m_a[i];
        }
      }
    }
  }  
  return *this;
}